

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alGetListenerf(ALenum param,ALfloat *value)

{
  ALfloat x;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetListenerf);
  writele32(param);
  IO_UINT64((uint64)value);
  (*REAL_alGetListenerf)(param,value);
  if (value == (ALfloat *)0x0) {
    x = 0.0;
  }
  else {
    x = *value;
  }
  writele32((uint32)x);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetListenerf(ALenum param, ALfloat *value)
{
    IO_START(alGetListenerf);
    IO_ENUM(param);
    IO_PTR(value);
    REAL_alGetListenerf(param, value);
    IO_FLOAT(value ? *value : 0.0f);
    IO_END();
}